

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

void __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::UnboundedTaskQueue
          (UnboundedTaskQueue<tf::Node_*> *this,int64_t LogSize)

{
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  *pvVar1;
  __pointer_type __p;
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  *in_RDI;
  memory_order __b_1;
  memory_order __b;
  int64_t in_stack_ffffffffffffff58;
  Array *this_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar2;
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  *__n;
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  *this_01;
  
  __n = in_RDI + 6;
  std::
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ::vector((vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
            *)0x109f3c);
  this_01 = in_RDI;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (in_RDI->
  super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pvVar1 = this_01 + 5;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar2 = 0;
  (pvVar1->
  super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (Array *)&this_01[5].
                      super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __p = (__pointer_type)operator_new(0x18);
  Array::Array(this_00,in_stack_ffffffffffffff58);
  std::atomic<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>::store
            ((atomic<tf::UnboundedTaskQueue<tf::Node_*>::Array_*> *)
             CONCAT44(uVar2,in_stack_ffffffffffffff70),__p,(memory_order)((ulong)this_00 >> 0x20));
  std::
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ::reserve(this_01,(size_type)__n);
  return;
}

Assistant:

UnboundedTaskQueue<T>::UnboundedTaskQueue(int64_t LogSize) {
  _top.store(0, std::memory_order_relaxed);
  _bottom.store(0, std::memory_order_relaxed);
  _array.store(new Array{(int64_t{1} << LogSize)}, std::memory_order_relaxed);
  _garbage.reserve(32);
}